

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layeredopacity.h
# Opt level: O0

void __thiscall LayeredOpacity::initialize(LayeredOpacity *this)

{
  mat4 m;
  vec4 color_00;
  vec4 color_01;
  vec4 color_02;
  undefined8 this_00;
  TransformNode *this_01;
  Node *pNVar1;
  Node *pNVar2;
  element_type *peVar3;
  float *pfVar4;
  AnimationManager *this_02;
  rect2d rVar5;
  shared_ptr<rengine::AbstractAnimation> local_168 [2];
  undefined1 local_148 [8];
  shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
  anim;
  vec2 local_120;
  vec2 local_118;
  vec2 local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  undefined1 auStack_100 [16];
  vec2 local_f0;
  vec2 local_e8;
  vec2 local_e0;
  vec2 local_d8;
  vec2 local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  vec4 vStack_c0;
  vec2 local_b0;
  vec2 local_a8;
  vec2 local_a0;
  vec2 local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  vec4 color;
  OpacityNode *opacityNode;
  float afStack_70 [2];
  float local_68 [2];
  float afStack_60 [2];
  float local_58 [2];
  float afStack_50 [2];
  float local_48 [2];
  float afStack_40 [2];
  uint local_38;
  TransformNode *local_30;
  TransformNode *root;
  vec2 local_20;
  vec2 s3;
  vec2 s;
  LayeredOpacity *this_local;
  
  s3 = Example::size(&this->super_Example);
  rengine::vec2::vec2((vec2 *)&root,3.0);
  local_20 = rengine::vec2::operator/(&s3,(vec2)root);
  this_01 = rengine::TransformNode::create();
  local_30 = this_01;
  rengine::mat4::translate2D((mat4 *)&opacityNode,s3.x * 0.5,s3.y * 0.5);
  m.m[2] = afStack_70[0];
  m.m[3] = afStack_70[1];
  m.m._0_8_ = opacityNode;
  m.m[4] = local_68[0];
  m.m[5] = local_68[1];
  m.m[6] = afStack_60[0];
  m.m[7] = afStack_60[1];
  m.m[8] = local_58[0];
  m.m[9] = local_58[1];
  m.m[10] = afStack_50[0];
  m.m[0xb] = afStack_50[1];
  m.m[0xc] = local_48[0];
  m.m[0xd] = local_48[1];
  m.m[0xe] = afStack_40[0];
  m.m[0xf] = afStack_40[1];
  m.type = local_38;
  rengine::TransformNode::setMatrix(this_01,m);
  color._8_8_ = rengine::OpacityNode::create();
  rengine::Node::append(&local_30->super_Node,(Node *)color._8_8_);
  rengine::vec4::vec4((vec4 *)&p_Stack_90,0.5,0.5,0.8,1.0);
  this_00 = color._8_8_;
  local_a8 = rengine::vec2::operator-(&local_20);
  local_b0 = local_20;
  rVar5 = rengine::rect2d::fromPosSize(local_a8,local_20);
  local_a0 = rVar5.tl;
  local_98 = rVar5.br;
  local_c8 = p_Stack_90;
  vStack_c0.x = color.x;
  vStack_c0.y = color.y;
  color_02.z = color.x;
  color_02.w = color.y;
  color_02._0_8_ = p_Stack_90;
  pNVar1 = (Node *)rengine::RectangleNode::create(rVar5,color_02);
  pNVar1 = rengine::Node::operator<<((Node *)this_00,pNVar1);
  local_e8 = rengine::vec2::operator-(&local_20);
  rengine::vec2::vec2(&local_f0,2.0);
  local_e0 = rengine::vec2::operator/(&local_e8,local_f0);
  auStack_100._8_4_ = local_20.x;
  auStack_100._12_4_ = local_20.y;
  rVar5 = rengine::rect2d::fromPosSize(local_e0,local_20);
  local_d8 = rVar5.tl;
  local_d0 = rVar5.br;
  local_108 = p_Stack_90;
  auStack_100._0_4_ = color.x;
  auStack_100._4_4_ = color.y;
  color_01.z = color.x;
  color_01.w = color.y;
  color_01._0_8_ = p_Stack_90;
  pNVar2 = (Node *)rengine::RectangleNode::create(rVar5,color_01);
  pNVar1 = rengine::Node::operator<<(pNVar1,pNVar2);
  rengine::vec2::vec2(&local_120,0.0);
  rVar5 = rengine::rect2d::fromPosSize(local_120,local_20);
  local_118 = rVar5.tl;
  local_110 = rVar5.br;
  anim.
  super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Stack_90;
  color_00.z = color.x;
  color_00.w = color.y;
  color_00._0_8_ = p_Stack_90;
  pNVar2 = (Node *)rengine::RectangleNode::create(rVar5,color_00);
  rengine::Node::operator<<(pNVar1,pNVar2);
  std::
  make_shared<rengine::Animation<rengine::OpacityNode,float,&rengine::OpacityNode::setOpacity,&rengine::AnimationCurves::smooth>,rengine::OpacityNode*&>
            ((OpacityNode **)local_148);
  peVar3 = std::
           __shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_148);
  rengine::AbstractAnimation::setDuration(&peVar3->super_AbstractAnimation,3.0);
  peVar3 = std::
           __shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_148);
  rengine::AbstractAnimation::setDirection(&peVar3->super_AbstractAnimation,Alternate);
  peVar3 = std::
           __shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_148);
  rengine::AbstractAnimation::setIterations(&peVar3->super_AbstractAnimation,-1);
  peVar3 = std::
           __shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_148);
  pfVar4 = rengine::
           Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
           ::newKeyFrame(peVar3,0.0);
  *pfVar4 = 1.0;
  peVar3 = std::
           __shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_148);
  pfVar4 = rengine::
           Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
           ::newKeyFrame(peVar3,1.0);
  *pfVar4 = 0.0;
  this_02 = Example::animationManager(&this->super_Example);
  std::shared_ptr<rengine::AbstractAnimation>::
  shared_ptr<rengine::Animation<rengine::OpacityNode,float,&rengine::OpacityNode::setOpacity,&rengine::AnimationCurves::smooth>,void>
            (local_168,
             (shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
              *)local_148);
  rengine::AnimationManager::start(this_02,local_168,0.0);
  std::shared_ptr<rengine::AbstractAnimation>::~shared_ptr(local_168);
  std::shared_ptr<rengine::AbstractAnimation>::operator=
            (&this->m_animation,
             (shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
              *)local_148);
  rengine::Node::append((Node *)this,&local_30->super_Node);
  std::
  shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
  ::~shared_ptr((shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
                 *)local_148);
  return;
}

Assistant:

void initialize() override {
        vec2 s = size();
        vec2 s3 = s / 3;

        // Root has origin in screen center
        TransformNode *root = TransformNode::create();
        root->setMatrix(mat4::translate2D(s.x * 0.5, s.y * 0.5));

        OpacityNode *opacityNode = OpacityNode::create();
        root->append(opacityNode);

        vec4 color(0.5, 0.5, 0.8, 1.0);

        *opacityNode << RectangleNode::create(rect2d::fromPosSize(-s3, s3), color)
                     << RectangleNode::create(rect2d::fromPosSize(-s3/2, s3), color)
                     << RectangleNode::create(rect2d::fromPosSize(vec2(), s3), color);

        auto anim = std::make_shared<Animation_OpacityNode_opacity>(opacityNode);
        anim->setDuration(3);
        anim->setDirection(AbstractAnimation::Alternate);
        anim->setIterations(-1);
        anim->newKeyFrame(0) = 1;
        anim->newKeyFrame(1) = 0;

        animationManager()->start(anim);

        m_animation = anim;

        append(root);
    }